

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

void TR_Exp(ast *node,C_OP *place)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  ast *paVar4;
  ast *paVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  attr *paVar8;
  int i;
  string *psVar9;
  undefined1 local_1b0 [48];
  undefined1 local_180 [48];
  undefined1 local_150 [152];
  undefined1 local_b8 [48];
  undefined1 local_88 [48];
  undefined1 local_58 [48];
  
  while( true ) {
    paVar4 = child(node,2);
    paVar5 = child(node,1);
    if (paVar4 == (ast *)0x0) {
      if (paVar5->type == 0x102) {
        std::__cxx11::string::string((string *)local_b8,paVar5->lex,(allocator *)local_180);
        Operand::Operand((Operand *)local_1b0,2,(string *)local_b8);
        IrSim::icAssign((InterCode *)local_150,&irSim,place,(Operand *)local_1b0);
        IrSim::commitIc(&irSim,(C_IC *)local_150);
        InterCode::~InterCode((InterCode *)local_150);
        psVar9 = (string *)(local_1b0 + 8);
      }
      else {
        if (paVar5->type != 0x11c) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                        ,0x228,"void TR_Exp(ast *, C_OP &)");
        }
        paVar8 = findvar(paVar5->lex);
        if (paVar8->kind != 1) {
          if (paVar8->kind != 0) {
            return;
          }
          std::__cxx11::string::string((string *)local_180,paVar5->lex,(allocator *)local_88);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&basics_abi_cxx11_,(key_type *)local_180);
          std::__cxx11::string::string((string *)local_b8,(string *)pmVar6);
          Operand::Operand((Operand *)local_1b0,(string *)local_b8);
          IrSim::icAssign((InterCode *)local_150,&irSim,place,(Operand *)local_1b0);
          IrSim::commitIc(&irSim,(C_IC *)local_150);
          InterCode::~InterCode((InterCode *)local_150);
          std::__cxx11::string::~string((string *)(local_1b0 + 8));
          std::__cxx11::string::~string((string *)local_b8);
          psVar9 = (string *)local_180;
          goto LAB_0010a8c9;
        }
        std::__cxx11::string::string((string *)local_150,paVar5->lex,(allocator *)local_1b0);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
                 ::operator[](&arrays_abi_cxx11_,(key_type *)local_150);
        std::__cxx11::string::string((string *)local_b8,(string *)&pmVar7->newName);
        std::__cxx11::string::~string((string *)local_150);
        bVar2 = IrSim::isArg(&irSim,(string *)local_b8);
        if (bVar2) {
          std::__cxx11::string::string((string *)local_88,paVar5->lex,(allocator *)local_58);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
                   ::operator[](&arrays_abi_cxx11_,(key_type *)local_88);
          std::__cxx11::string::string((string *)local_180,(string *)&pmVar7->newName);
          Operand::Operand((Operand *)local_1b0,(string *)local_180);
          IrSim::icAssign((InterCode *)local_150,&irSim,place,(Operand *)local_1b0);
          IrSim::commitIc(&irSim,(C_IC *)local_150);
        }
        else {
          std::__cxx11::string::string((string *)local_88,paVar5->lex,(allocator *)local_58);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
                   ::operator[](&arrays_abi_cxx11_,(key_type *)local_88);
          std::__cxx11::string::string((string *)local_180,(string *)&pmVar7->newName);
          Operand::Operand((Operand *)local_1b0,(string *)local_180);
          IrSim::icRef((InterCode *)local_150,&irSim,place,(Operand *)local_1b0);
          IrSim::commitIc(&irSim,(C_IC *)local_150);
        }
        InterCode::~InterCode((InterCode *)local_150);
        std::__cxx11::string::~string((string *)(local_1b0 + 8));
        std::__cxx11::string::~string((string *)local_180);
        std::__cxx11::string::~string((string *)local_88);
        std::__cxx11::string::string((string *)local_150,paVar5->lex,(allocator *)local_1b0);
        std::__cxx11::string::_M_assign((string *)&irSim.curArray);
        psVar9 = (string *)local_150;
      }
      std::__cxx11::string::~string(psVar9);
      psVar9 = (string *)local_b8;
      goto LAB_0010a8c9;
    }
    iVar3 = paVar4->type;
    if (iVar3 == 0x112) break;
    irSim.curDim = -1;
    if (iVar3 != -0x26fd) {
      if (iVar3 == 0x106) {
        TR_ASSIGNOP(paVar4,place);
        return;
      }
      if (iVar3 != 0x110) {
        paVar5 = paVar4;
        if (iVar3 == 0x10e) {
          std::operator<<((ostream *)&std::cerr,"Structure not implemented!\n");
          exit(1);
        }
        goto LAB_0010a4ab;
      }
      paVar5 = sibling(paVar4,-1);
      paVar8 = findfunc(paVar5->lex);
      paVar5 = sibling(paVar4,1);
      if (paVar5->type == 0x111) {
        std::__cxx11::string::string((string *)local_150,"read",(allocator *)local_1b0);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_150,((paVar8->field_1).basic)->name);
        std::__cxx11::string::~string((string *)local_150);
        if (bVar2) {
          IrSim::icRead((InterCode *)local_150,&irSim,place);
          IrSim::commitIc(&irSim,(InterCode *)local_150);
          InterCode::~InterCode((InterCode *)local_150);
          return;
        }
        Operand::Operand((Operand *)local_1b0,((paVar8->field_1).basic)->name);
        IrSim::icCall((InterCode *)local_150,&irSim,place,(Operand *)local_1b0);
        IrSim::commitIc(&irSim,(C_IC *)local_150);
      }
      else {
        std::__cxx11::string::string((string *)local_150,"write",(allocator *)local_1b0);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_150,((paVar8->field_1).basic)->name);
        std::__cxx11::string::~string((string *)local_150);
        if (!bVar2) {
          paVar5 = child(paVar5,1);
          TR_Args((Operand *)local_b8,paVar5,true);
          std::__cxx11::string::~string((string *)(local_b8 + 8));
          Operand::Operand((Operand *)local_1b0,place);
          if (place->kind == 0) {
            IrSim::newTmpVar((Operand *)local_150,&irSim);
            Operand::operator=((Operand *)local_1b0,(Operand *)local_150);
            std::__cxx11::string::~string((string *)(local_150 + 8));
          }
          Operand::Operand((Operand *)local_180,((paVar8->field_1).basic)->name);
          IrSim::icCall((InterCode *)local_150,&irSim,(C_OP *)local_1b0,(C_OP *)local_180);
          IrSim::commitIc(&irSim,(C_IC *)local_150);
          InterCode::~InterCode((InterCode *)local_150);
          puVar1 = local_180;
          goto LAB_0010a60c;
        }
        paVar5 = child(paVar5,1);
        TR_Args((Operand *)local_1b0,paVar5,false);
        IrSim::icWrite((InterCode *)local_150,&irSim,(Operand *)local_1b0);
        IrSim::commitIc(&irSim,(C_IC *)local_150);
      }
      goto LAB_0010a64f;
    }
    iVar3 = paVar5->type;
    node = paVar4;
    if (iVar3 != 0x110) goto code_r0x0010a0f0;
  }
  IrSim::newTmpVar((Operand *)local_1b0,&irSim);
  IrSim::newTmpVar((Operand *)local_b8,&irSim);
  IrSim::newTmpVar((Operand *)local_180,&irSim);
  IrSim::newTmpVar((Operand *)local_88,&irSim);
  i = irSim.curDim + 1;
  irSim.curDim = i;
  paVar5 = sibling(paVar4,1);
  TR_Exp(paVar5,(C_OP *)local_b8);
  paVar5 = sibling(paVar4,-1);
  TR_Exp(paVar5,(C_OP *)local_1b0);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
           ::operator[](&arrays_abi_cxx11_,&irSim.curArray);
  iVar3 = Array::getSize(pmVar7,i);
  Operand::Operand((Operand *)local_58,iVar3);
  IrSim::icBinOp((InterCode *)local_150,&irSim,3,(C_OP *)local_180,(C_OP *)local_b8,(C_OP *)local_58
                );
  IrSim::commitIc(&irSim,(C_IC *)local_150);
  InterCode::~InterCode((InterCode *)local_150);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  IrSim::icBinOp((InterCode *)local_150,&irSim,1,(C_OP *)local_88,(C_OP *)local_1b0,
                 (C_OP *)local_180);
  IrSim::commitIc(&irSim,(C_IC *)local_150);
  InterCode::~InterCode((InterCode *)local_150);
  if (i == 0) {
    IrSim::icDeref((InterCode *)local_150,&irSim,place,(C_OP *)local_88);
    IrSim::commitIc(&irSim,(C_IC *)local_150);
    InterCode::~InterCode((InterCode *)local_150);
    irSim.curDim = -1;
  }
  else {
    IrSim::icAssign((InterCode *)local_150,&irSim,place,(C_OP *)local_88);
    IrSim::commitIc(&irSim,(C_IC *)local_150);
    InterCode::~InterCode((InterCode *)local_150);
  }
  std::__cxx11::string::~string((string *)(local_88 + 8));
  std::__cxx11::string::~string((string *)(local_180 + 8));
  puVar1 = local_b8;
LAB_0010a60c:
  std::__cxx11::string::~string((string *)(puVar1 + 8));
LAB_0010a659:
  psVar9 = (string *)(local_1b0 + 8);
LAB_0010a8c9:
  std::__cxx11::string::~string(psVar9);
  return;
code_r0x0010a0f0:
  if (iVar3 == 0x10f) {
LAB_0010a4ab:
    TR_ARITH(paVar5,place);
    return;
  }
  if (iVar3 != 0x109) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                  ,0x21b,"void TR_Exp(ast *, C_OP &)");
  }
  IrSim::newTmpVar((Operand *)local_1b0,&irSim);
  paVar4 = sibling(paVar5,1);
  TR_Exp(paVar4,(C_OP *)local_1b0);
  IrSim::icArith((InterCode *)local_150,&irSim,paVar5,place,&OP_ZERO,(C_OP *)local_1b0);
  IrSim::commitIc(&irSim,(C_IC *)local_150);
LAB_0010a64f:
  InterCode::~InterCode((InterCode *)local_150);
  goto LAB_0010a659;
}

Assistant:

static void TR_Exp(ast *node, C_OP &place) {
    ast *c2 = child(node, 2), *c1 = child(node, 1);
    if (c2) {
        if (c2->type != LB) irSim.resetCurDim();
        switch (c2->type) {
            default:            TR_ARITH(c2, place);    break;
            case ASSIGNOP:      TR_ASSIGNOP(c2, place); break;
            case LP:            TR_CallFunc(c2, place); break;
            case Exp:
                switch (c1->type) {
                    case MINUS: TR_MINUS(c1, place);    break;
                    case LP:    TR_Exp(c2, place);      break;
                    case NOT:   TR_ARITH(c1, place);    break;
                    default:    assert(false);
                }
                break;
            case LB:            TR_LB(c2, place);       break;
            case DOT: /* TODO: Struct */
                IMP_ME("Structure");
                break;
        }
    }
    else {
        switch (c1->type) {
            case ID:  TR_ID(c1, place);  break;
            case INT: TR_INT(c1, place); break;
            default:  assert(false);
        }
    }
}